

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::dispatch::detail::Build_Function_Caller_Helper<chaiscript::Boxed_Value>::operator()<>
          (Build_Function_Caller_Helper<chaiscript::Boxed_Value> *this)

{
  Type_Conversions *pTVar1;
  _Map_base<void_*,_std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>,_std::allocator<std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
  *in_RSI;
  Boxed_Value BVar2;
  Type_Conversions_State state;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> local_48;
  Type_Conversions_State local_30;
  
  pTVar1 = (Type_Conversions *)
           in_RSI[1].
           super__Vector_base<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar1 == (Type_Conversions *)0x0) {
    local_48.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Function_Caller_Ret<chaiscript::Boxed_Value,_false>::call
              ((Function_Caller_Ret<chaiscript::Boxed_Value,_false> *)this,in_RSI,&local_48,
               (Type_Conversions_State *)0x0);
  }
  else {
    this_00 = (_Map_base<void_*,_std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>,_std::allocator<std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               *)chaiscript::detail::threading::
                 Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves>::t();
    local_30.m_saves._M_data =
         std::__detail::
         _Map_base<void_*,_std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>,_std::allocator<std::pair<void_*const,_chaiscript::Type_Conversions::Conversion_Saves>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
         ::operator[](this_00,&(pTVar1->m_conversion_saves).m_key);
    local_48.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_30.m_conversions._M_data = pTVar1;
    Function_Caller_Ret<chaiscript::Boxed_Value,_false>::call
              ((Function_Caller_Ret<chaiscript::Boxed_Value,_false> *)this,in_RSI,&local_48,
               &local_30);
  }
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector(&local_48)
  ;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret operator()(P&&  ...  param)
          {
            if (m_conversions) {
              Type_Conversions_State state(*m_conversions, m_conversions->conversion_saves());
              return Function_Caller_Ret<Ret, std::is_arithmetic<Ret>::value && !std::is_same<Ret, bool>::value>::call(m_funcs, { 
                  box<P>(std::forward<P>(param))...
                  }, &state
                  );
            } else {
              return Function_Caller_Ret<Ret, std::is_arithmetic<Ret>::value && !std::is_same<Ret, bool>::value>::call(m_funcs, { 
                  box<P>(std::forward<P>(param))...
                  }, nullptr
                  );
            }

          }